

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<unsigned_int>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  _Optional_payload_base<unsigned_int> local_30;
  Optional<unsigned_int> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  opt.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload = (_Storage<unsigned_int,_true>)indent;
  opt.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._7_1_ = fixed;
  if (fixed) {
    uVar2 = Struct::GetField<unsigned_int>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<unsigned_int>
              (this,uVar2,&(fd->value).type,
               opt.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload._M_value);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      local_30 = (_Optional_payload_base<unsigned_int>)
                 Table::GetOptional<unsigned_int,unsigned_int>(table,(fd->value).offset);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30);
      if (bVar1) {
        puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_30);
        PrintScalar<unsigned_int>
                  (this,*puVar3,&(fd->value).type,
                   opt.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload._M_value);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      uVar2 = GetFieldDefault<unsigned_int>(fd);
      uVar2 = Table::GetField<unsigned_int>(table,field,uVar2);
      PrintScalar<unsigned_int>
                (this,uVar2,&(fd->value).type,
                 opt.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }